

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

void __thiscall google::protobuf::UnknownFieldSet::ClearFallback(UnknownFieldSet *this)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  pointer pUVar2;
  LogMessage *other;
  long lVar3;
  long lVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  pvVar1 = this->fields_;
  if ((pvVar1 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) ||
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start)) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.cc"
               ,0x4a);
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: fields_ != NULL && fields_->size() > 0: ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  lVar3 = (long)(int)((ulong)((long)(this->fields_->
                                    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->fields_->
                                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 4);
  lVar4 = lVar3 + 1;
  lVar3 = lVar3 << 4;
  do {
    UnknownField::Delete
              ((UnknownField *)
               ((long)&(this->fields_->
                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                       )._M_impl.super__Vector_impl_data._M_start[-1].number_ + lVar3));
    lVar4 = lVar4 + -1;
    lVar3 = lVar3 + -0x10;
  } while (1 < lVar4);
  pvVar1 = this->fields_;
  if (pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 *)0x0) {
    pUVar2 = (pvVar1->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pUVar2 != (pointer)0x0) {
      operator_delete(pUVar2,(long)(pvVar1->
                                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                   )._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)pUVar2);
    }
    operator_delete(pvVar1,0x18);
  }
  this->fields_ =
       (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
       0x0;
  return;
}

Assistant:

void UnknownFieldSet::ClearFallback() {
  GOOGLE_DCHECK(fields_ != NULL && fields_->size() > 0);
  int n = fields_->size();
  do {
    (*fields_)[--n].Delete();
  } while (n > 0);
  delete fields_;
  fields_ = NULL;
}